

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O2

void __thiscall adios2::Transport::WriteV(Transport *this,iovec *iov,int iovcnt,size_t start)

{
  long lVar1;
  
  if (iovcnt < 1) {
    if (start != 0xffffffffffffffff) {
      (*this->_vptr_Transport[0xf])(this,start);
      return;
    }
  }
  else {
    (*this->_vptr_Transport[6])(this,iov->iov_base,iov->iov_len);
    for (lVar1 = 0; (ulong)(uint)iovcnt * 0x10 + -0x10 != lVar1; lVar1 = lVar1 + 0x10) {
      (*this->_vptr_Transport[6])
                (this,*(undefined8 *)((long)&iov[1].iov_base + lVar1),
                 *(undefined8 *)((long)&iov[1].iov_len + lVar1),0xffffffffffffffff);
    }
  }
  return;
}

Assistant:

void Transport::WriteV(const core::iovec *iov, const int iovcnt, size_t start)
{
    if (iovcnt > 0)
    {
        Write(static_cast<const char *>(iov[0].iov_base), iov[0].iov_len, start);
        for (int c = 1; c < iovcnt; ++c)
        {
            Write(static_cast<const char *>(iov[c].iov_base), iov[c].iov_len);
        }
    }
    else if (start != MaxSizeT)
    {
        Seek(start);
    }
}